

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_base64_encode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char cVar2;
  undefined8 in_RAX;
  char *pcVar3;
  uint uVar4;
  undefined2 local_38;
  int nLen;
  
  if (0 < nArg) {
    _local_38 = in_RAX;
    pcVar3 = jx9_value_to_string(*apArg,&nLen);
    iVar1 = nLen;
    if (0 < nLen) {
      uVar4 = 0;
      while( true ) {
        if ((uint)iVar1 <= uVar4 + 2) break;
        local_38 = CONCAT11("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                            [(byte)((byte)pcVar3[uVar4 + 1] >> 4 | pcVar3[uVar4] << 4) & 0x3f],
                            "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                            [(byte)pcVar3[uVar4] >> 2]);
        _local_38 = CONCAT12("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                             [(byte)((byte)pcVar3[uVar4 + 2] >> 6 | pcVar3[uVar4 + 1] << 2) & 0x3f],
                             local_38);
        _local_38 = CONCAT13("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                             [(byte)pcVar3[uVar4 + 2] & 0x3f],_local_38);
        jx9_result_string(pCtx,(char *)&stack0xffffffffffffffc8,4);
        uVar4 = uVar4 + 3;
      }
      if (uVar4 + 1 < (uint)iVar1) {
        local_38 = CONCAT11("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                            [(byte)((byte)pcVar3[uVar4 + 1] >> 4 | pcVar3[uVar4] << 4) & 0x3f],
                            "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                            [(byte)pcVar3[uVar4] >> 2]);
        cVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(ulong)((byte)pcVar3[uVar4 + 1] & 0xf) * 4];
      }
      else {
        if ((uint)iVar1 <= uVar4) {
          return 0;
        }
        local_38 = CONCAT11("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                            [((byte)pcVar3[uVar4] & 3) << 4],
                            "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                            [(byte)pcVar3[uVar4] >> 2]);
        cVar2 = '=';
      }
      _local_38 = CONCAT12(cVar2,local_38);
      _local_38 = CONCAT13(0x3d,_local_38);
      jx9_result_string(pCtx,(char *)&stack0xffffffffffffffc8,4);
      return 0;
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_base64_encode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the BASE64 encoding */
	SyBase64Encode(zIn, (sxu32)nLen, Consumer, pCtx);
	return JX9_OK;
}